

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O2

void __thiscall
flatbuffers::cpp::CppGenerator::GenEnumStringTable(CppGenerator *this,EnumDef *enum_def)

{
  CodeWriter *pCVar1;
  EnumDef *this_00;
  uint64_t uVar2;
  EnumVal *pEVar3;
  string *this_01;
  pointer ppEVar4;
  string vals;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  string local_3c0;
  pointer local_3a0;
  EnumDef *local_398;
  string local_390;
  string local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  string local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  uVar2 = EnumDef::Distance(enum_def);
  local_398 = enum_def;
  if (uVar2 / (ulong)((long)(enum_def->vals).vec.
                            super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(enum_def->vals).vec.
                            super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) < 5) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,"inline const char * const *EnumNames{{ENUM_NAME}}() {",
               (allocator<char> *)&local_3e0);
    pCVar1 = &this->code_;
    CodeWriter::operator+=(pCVar1,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    NumToString<unsigned_long>(&local_3c0,uVar2 + 2);
    std::operator+(&local_3e0,"  static const char * const names[",&local_3c0);
    std::operator+(&local_d0,&local_3e0,"] = {");
    CodeWriter::operator+=(pCVar1,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_3e0);
    std::__cxx11::string::~string((string *)&local_3c0);
    ppEVar4 = (enum_def->vals).vec.
              super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    local_3a0 = (enum_def->vals).vec.
                super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    pEVar3 = *ppEVar4;
    for (; ppEVar4 != local_3a0; ppEVar4 = ppEVar4 + 1) {
      for (uVar2 = EnumDef::Distance(local_398,pEVar3,*ppEVar4); 1 < uVar2; uVar2 = uVar2 - 1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,"    \"\",",(allocator<char> *)&local_3e0);
        CodeWriter::operator+=(pCVar1,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
      }
      pEVar3 = *ppEVar4;
      EscapeKeyword(&local_3c0,this,&pEVar3->name);
      std::operator+(&local_3e0,"    \"",&local_3c0);
      std::operator+(&local_70,&local_3e0,"\",");
      CodeWriter::operator+=(pCVar1,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_3e0);
      std::__cxx11::string::~string((string *)&local_3c0);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0,"    nullptr",(allocator<char> *)&local_3e0);
    CodeWriter::operator+=(pCVar1,&local_f0);
    this_00 = local_398;
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_110,"  };",(allocator<char> *)&local_3e0);
    CodeWriter::operator+=(pCVar1,&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_130,"  return names;",(allocator<char> *)&local_3e0);
    CodeWriter::operator+=(pCVar1,&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_150,"}",(allocator<char> *)&local_3e0);
    CodeWriter::operator+=(pCVar1,&local_150);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_170,"",(allocator<char> *)&local_3e0);
    CodeWriter::operator+=(pCVar1,&local_170);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_190,"inline const char *EnumName{{ENUM_NAME}}({{ENUM_NAME}} e) {",
               (allocator<char> *)&local_3e0);
    CodeWriter::operator+=(pCVar1,&local_190);
    std::__cxx11::string::~string((string *)&local_190);
    pEVar3 = EnumDef::MinValue(this_00);
    GetEnumValUse_abi_cxx11_(&local_370,this,this_00,pEVar3);
    std::operator+(&local_350,"  if (::flatbuffers::IsOutRange(e, ",&local_370);
    std::operator+(&local_3c0,&local_350,", ");
    pEVar3 = EnumDef::MaxValue(this_00);
    GetEnumValUse_abi_cxx11_(&local_390,this,this_00,pEVar3);
    std::operator+(&local_3e0,&local_3c0,&local_390);
    std::operator+(&local_1b0,&local_3e0,")) return \"\";");
    CodeWriter::operator+=(pCVar1,&local_1b0);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_3e0);
    std::__cxx11::string::~string((string *)&local_390);
    std::__cxx11::string::~string((string *)&local_3c0);
    std::__cxx11::string::~string((string *)&local_350);
    std::__cxx11::string::~string((string *)&local_370);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d0,"  const size_t index = static_cast<size_t>(e)\\",
               (allocator<char> *)&local_3e0);
    CodeWriter::operator+=(pCVar1,&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    pEVar3 = EnumDef::MinValue(this_00);
    if (pEVar3->value != 0) {
      pEVar3 = EnumDef::MinValue(this_00);
      GetEnumValUse_abi_cxx11_(&local_3e0,this,this_00,pEVar3);
      std::operator+(&local_3c0," - static_cast<size_t>(",&local_3e0);
      std::operator+(&local_1f0,&local_3c0,")\\");
      CodeWriter::operator+=(pCVar1,&local_1f0);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::string::~string((string *)&local_3c0);
      std::__cxx11::string::~string((string *)&local_3e0);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_210,";",(allocator<char> *)&local_3e0);
    CodeWriter::operator+=(pCVar1,&local_210);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_230,"  return EnumNames{{ENUM_NAME}}()[index];",
               (allocator<char> *)&local_3e0);
    CodeWriter::operator+=(pCVar1,&local_230);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_250,"}",(allocator<char> *)&local_3e0);
    CodeWriter::operator+=(pCVar1,&local_250);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_270,"",(allocator<char> *)&local_3e0);
    CodeWriter::operator+=(pCVar1,&local_270);
    this_01 = &local_270;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_290,"inline const char *EnumName{{ENUM_NAME}}({{ENUM_NAME}} e) {",
               (allocator<char> *)&local_3e0);
    pCVar1 = &this->code_;
    CodeWriter::operator+=(pCVar1,&local_290);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2b0,"  switch (e) {",(allocator<char> *)&local_3e0);
    CodeWriter::operator+=(pCVar1,&local_2b0);
    std::__cxx11::string::~string((string *)&local_2b0);
    local_3a0 = (enum_def->vals).vec.
                super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    for (ppEVar4 = (enum_def->vals).vec.
                   super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppEVar4 != local_3a0;
        ppEVar4 = ppEVar4 + 1) {
      GetEnumValUse_abi_cxx11_(&local_370,this,local_398,*ppEVar4);
      std::operator+(&local_350,"    case ",&local_370);
      std::operator+(&local_3c0,&local_350,": return \"");
      EscapeKeyword(&local_390,this,&(*ppEVar4)->name);
      std::operator+(&local_3e0,&local_3c0,&local_390);
      std::operator+(&local_90,&local_3e0,"\";");
      CodeWriter::operator+=(pCVar1,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_3e0);
      std::__cxx11::string::~string((string *)&local_390);
      std::__cxx11::string::~string((string *)&local_3c0);
      std::__cxx11::string::~string((string *)&local_350);
      std::__cxx11::string::~string((string *)&local_370);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2d0,"    default: return \"\";",(allocator<char> *)&local_3e0);
    CodeWriter::operator+=(pCVar1,&local_2d0);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2f0,"  }",(allocator<char> *)&local_3e0);
    CodeWriter::operator+=(pCVar1,&local_2f0);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_310,"}",(allocator<char> *)&local_3e0);
    CodeWriter::operator+=(pCVar1,&local_310);
    std::__cxx11::string::~string((string *)&local_310);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_330,"",(allocator<char> *)&local_3e0);
    CodeWriter::operator+=(pCVar1,&local_330);
    this_01 = &local_330;
  }
  std::__cxx11::string::~string((string *)this_01);
  return;
}

Assistant:

void GenEnumStringTable(const EnumDef &enum_def) {
    auto range = enum_def.Distance();
    // Average distance between values above which we consider a table
    // "too sparse". Change at will.
    static const uint64_t kMaxSparseness = 5;
    if (range / static_cast<uint64_t>(enum_def.size()) < kMaxSparseness) {
      code_ += "inline const char * const *EnumNames{{ENUM_NAME}}() {";
      code_ += "  static const char * const names[" +
               NumToString(range + 1 + 1) + "] = {";

      auto val = enum_def.Vals().front();
      for (const auto &enum_value : enum_def.Vals()) {
        for (auto k = enum_def.Distance(val, enum_value); k > 1; --k) {
          code_ += "    \"\",";
        }
        val = enum_value;
        code_ += "    \"" + Name(*enum_value) + "\",";
      }
      code_ += "    nullptr";
      code_ += "  };";

      code_ += "  return names;";
      code_ += "}";
      code_ += "";

      code_ += "inline const char *EnumName{{ENUM_NAME}}({{ENUM_NAME}} e) {";

      code_ += "  if (::flatbuffers::IsOutRange(e, " +
               GetEnumValUse(enum_def, *enum_def.MinValue()) + ", " +
               GetEnumValUse(enum_def, *enum_def.MaxValue()) +
               ")) return \"\";";

      code_ += "  const size_t index = static_cast<size_t>(e)\\";
      if (enum_def.MinValue()->IsNonZero()) {
        auto vals = GetEnumValUse(enum_def, *enum_def.MinValue());
        code_ += " - static_cast<size_t>(" + vals + ")\\";
      }
      code_ += ";";

      code_ += "  return EnumNames{{ENUM_NAME}}()[index];";
      code_ += "}";
      code_ += "";
    } else {
      code_ += "inline const char *EnumName{{ENUM_NAME}}({{ENUM_NAME}} e) {";
      code_ += "  switch (e) {";
      for (const auto &ev : enum_def.Vals()) {
        code_ += "    case " + GetEnumValUse(enum_def, *ev) + ": return \"" +
                 Name(*ev) + "\";";
      }
      code_ += "    default: return \"\";";
      code_ += "  }";
      code_ += "}";
      code_ += "";
    }
  }